

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O3

void term_keyinputw(Terminal *term,wchar_t *widebuf,wchar_t len)

{
  char *__s;
  strbuf *buf_o;
  size_t sVar1;
  wchar_t len_00;
  
  buf_o = term_input_data_from_unicode(term,widebuf,len);
  sVar1 = buf_o->len;
  if (sVar1 != 0) {
    __s = buf_o->s;
    len_00 = (wchar_t)sVar1;
    if (term->srm_echo == true) {
      if (len_00 < L'\0') {
        sVar1 = strlen(__s);
      }
      bufchain_add(&term->inbuf,__s,(long)(int)sVar1);
      term_added_data(term,false);
    }
    if (term->bracketed_paste_active == true) {
      if (term->ldisc != (Ldisc *)0x0) {
        ldisc_send(term->ldisc,"\x1b[201~",L'\x06',false);
      }
      term->bracketed_paste_active = false;
    }
    if (term->ldisc != (Ldisc *)0x0) {
      ldisc_send(term->ldisc,__s,len_00,true);
    }
    term_seen_key_event(term);
  }
  strbuf_free(buf_o);
  return;
}

Assistant:

void term_keyinputw(Terminal *term, const wchar_t *widebuf, int len)
{
    strbuf *buf = term_input_data_from_unicode(term, widebuf, len);
    if (buf->len)
        term_keyinput_internal(term, buf->s, buf->len, true);
    strbuf_free(buf);
}